

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

int __thiscall hwtest::pgraph::anon_unknown_2::ScanDmaTest::run(ScanDmaTest *this)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  pointer pRVar4;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range4_1;
  unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *reg;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
  *__range4;
  ScanDmaTest *this_local;
  
  if ((this->super_ScanTest).super_Test.chipset.card_type < 4) {
    pgraph_dma_nv3_regs((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                         *)&__begin4,&(this->super_ScanTest).super_Test.chipset);
    __end4 = std::
             vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
             ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                      *)&__begin4);
    reg = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
          std::
          vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
          ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                 *)&__begin4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                                       *)&reg), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
               ::operator*(&__end4);
      pRVar4 = std::
               unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
               ::operator->(puVar3);
      uVar2 = (*pRVar4->_vptr_Register[10])
                        (pRVar4,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                         &(this->super_ScanTest).super_Test.rnd);
      if ((uVar2 & 1) != 0) {
        (this->super_ScanTest).res = 3;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
      ::operator++(&__end4);
    }
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin4);
  }
  else {
    pgraph_dma_nv4_regs((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                         *)&__begin4_1,&(this->super_ScanTest).super_Test.chipset);
    __end4_1 = std::
               vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               ::begin((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                        *)&__begin4_1);
    reg_1 = (unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_> *)
            std::
            vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
            ::end((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
                   *)&__begin4_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4_1,
                              (__normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
                               *)&reg_1), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
               ::operator*(&__end4_1);
      pRVar4 = std::
               unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>
               ::operator->(puVar3);
      uVar2 = (*pRVar4->_vptr_Register[10])
                        (pRVar4,(ulong)(uint)(this->super_ScanTest).super_Test.cnum,
                         &(this->super_ScanTest).super_Test.rnd);
      if ((uVar2 & 1) != 0) {
        (this->super_ScanTest).res = 3;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_*,_std::vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>_>
      ::operator++(&__end4_1);
    }
    std::
    vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
    ::~vector((vector<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>,_std::allocator<std::unique_ptr<hwtest::pgraph::Register,_std::default_delete<hwtest::pgraph::Register>_>_>_>
               *)&__begin4_1);
  }
  return (this->super_ScanTest).res;
}

Assistant:

int run() override {
		if (chipset.card_type < 4) {
			for (auto &reg : pgraph_dma_nv3_regs(chipset)) {
				if (reg->scan_test(cnum, rnd))
					res = HWTEST_RES_FAIL;
			}
		} else {
			for (auto &reg : pgraph_dma_nv4_regs(chipset)) {
				if (reg->scan_test(cnum, rnd))
					res = HWTEST_RES_FAIL;
			}
		}
		return res;
	}